

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * __thiscall
Lowerer::GenerateArrayTest
          (Lowerer *this,RegOpnd *baseOpnd,LabelInstr *isNotObjectLabel,LabelInstr *isNotArrayLabel,
          Instr *insertBeforeInstr,bool forceFloat,bool isStore,bool allowDefiniteArray)

{
  LowererMD *this_00;
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  ObjectType OVar5;
  ValueType valueType;
  VTableValue VVar6;
  VTableValue VVar7;
  int iVar8;
  undefined4 *puVar9;
  Lowerer *pLVar10;
  IntConstOpnd *src2;
  AddrOpnd *pAVar11;
  intptr_t pMemLoc;
  MemRefOpnd *pMVar12;
  undefined4 extraout_var;
  IndirOpnd *pIVar13;
  BranchInstr *pBVar14;
  LabelInstr *instr;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Instr *instr_00;
  Lowerer *pLVar15;
  undefined7 in_register_00000089;
  long lVar16;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  LabelInstr *local_58;
  LabelInstr *local_50;
  Lowerer *local_48;
  Func *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType arrayValueType;
  ValueType baseValueType;
  
  local_58 = (LabelInstr *)CONCAT44(local_58._4_4_,(int)CONCAT71(in_register_00000089,forceFloat));
  local_48 = this;
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bdf,"(baseOpnd)","baseOpnd");
    if (!bVar3) goto LAB_005d76f0;
    *puVar9 = 0;
  }
  local_32[0] = (baseOpnd->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (bVar3 && !allowDefiniteArray) {
    bVar3 = ValueType::IsNativeArray((ValueType *)&local_32[0].field_0);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3be4,
                         "(!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray())"
                         ,
                         "!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray()"
                        );
      if (!bVar3) goto LAB_005d76f0;
      *puVar9 = 0;
    }
  }
  bVar3 = ValueType::IsUninitialized((ValueType *)&local_32[0].field_0);
  if (!bVar3) {
    bVar3 = ValueType::HasBeenObject((ValueType *)&local_32[0].field_0);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3be5,
                         "(baseValueType.IsUninitialized() || baseValueType.HasBeenObject())",
                         "baseValueType.IsUninitialized() || baseValueType.HasBeenObject()");
      if (!bVar3) goto LAB_005d76f0;
      *puVar9 = 0;
    }
  }
  if (isNotObjectLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be7,"(isNotObjectLabel)","isNotObjectLabel");
    if (!bVar3) goto LAB_005d76f0;
    *puVar9 = 0;
  }
  if (isNotArrayLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be8,"(isNotArrayLabel)","isNotArrayLabel");
    if (!bVar3) goto LAB_005d76f0;
    *puVar9 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be9,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_005d76f0;
    *puVar9 = 0;
  }
  local_40 = insertBeforeInstr->m_func;
  local_80 = (undefined1  [8])0x0;
  autoReuseArrayOpnd.func._1_1_ = 1;
  bVar3 = ValueType::IsLikelyObject((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    OVar5 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
    if (OVar5 != ObjectWithArray) goto LAB_005d7055;
    pLVar10 = local_48;
    GenerateObjectTypeTest(local_48,baseOpnd,insertBeforeInstr,isNotObjectLabel);
    GenerateObjectHeaderInliningTest(pLVar10,baseOpnd,isNotArrayLabel,insertBeforeInstr);
    pLVar10 = (Lowerer *)LoadObjectArray(pLVar10,baseOpnd,insertBeforeInstr);
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,(Opnd *)pLVar10,local_40,false);
    InsertTest((Opnd *)pLVar10,(Opnd *)pLVar10,insertBeforeInstr);
    InsertBranch(BrEq_A,false,isNotArrayLabel,insertBeforeInstr);
    src2 = IR::IntConstOpnd::New(1,TyUint8,local_40,true);
    InsertTest((Opnd *)pLVar10,&src2->super_Opnd,insertBeforeInstr);
    InsertBranch(BrNeq_A,false,isNotArrayLabel,insertBeforeInstr);
  }
  else {
LAB_005d7055:
    bVar3 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
    if (!bVar3) {
      LowererMD::GenerateObjectTest
                (&local_48->m_lowererMD,&baseOpnd->super_Opnd,insertBeforeInstr,isNotObjectLabel,
                 false);
    }
    pLVar10 = (Lowerer *)IR::Opnd::Copy(&baseOpnd->super_Opnd,local_40);
    OVar4 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005d76f0;
      *puVar9 = 0;
    }
    bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
    if (!bVar3) {
      local_5a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Array);
      local_5c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_5a.field_0);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_5c.field_0,false);
      valueType = ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
      IR::Opnd::SetValueType((Opnd *)pLVar10,valueType);
    }
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,(Opnd *)pLVar10,local_40,false);
  }
  bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  VVar6 = VtableJavascriptArray;
  if (bVar3) {
    VVar6 = GetArrayVtableAddress((ValueType)local_32[0].field_0,false);
  }
  bVar3 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)&local_32[0].field_0);
  local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,2);
  if (bVar3) {
    VVar7 = GetArrayVtableAddress((ValueType)local_32[0].field_0,true);
    local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,VVar7);
  }
  if (isStore) {
    if (VVar6 != VtableJavascriptArray) {
      bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
      if (!bVar3) goto LAB_005d7292;
    }
    pAVar11 = (AddrOpnd *)IR::RegOpnd::New(TyUint64,local_40);
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    lVar16 = 0x98;
    if (bVar3) {
      bVar3 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      lVar16 = 0xa0;
      if (!bVar3) {
        bVar3 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
        lVar16 = 0xa8;
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          autoReuseArrayOpnd._16_8_ = __tls_get_addr(&PTR_01548f08);
          *(undefined4 *)autoReuseArrayOpnd._16_8_ = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x3c34,"(baseValueType.HasFloatElements())",
                             "baseValueType.HasFloatElements()");
          if (!bVar3) goto LAB_005d76f0;
          *(undefined4 *)autoReuseArrayOpnd._16_8_ = 0;
        }
      }
    }
    pMemLoc = (**(code **)((long)local_48->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo +
                          lVar16))();
    pMVar12 = IR::MemRefOpnd::New(pMemLoc,TyUint64,insertBeforeInstr->m_func,AddrOpndKindDynamicMisc
                                 );
    InsertMove((Opnd *)pAVar11,&pMVar12->super_Opnd,insertBeforeInstr,true);
  }
  else {
LAB_005d7292:
    pSVar1 = insertBeforeInstr->m_func->m_scriptContextInfo;
    iVar8 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,(ulong)VVar6);
    pAVar11 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar8),AddrOpndKindDynamicVtable,
                                local_48->m_func,false,(Var)0x0);
  }
  if ((char)local_58 != '\0') {
    bVar3 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_32[0].field_0);
    if (bVar3) {
      local_50 = IR::LabelInstr::New(Label,local_48->m_func,false);
      pLVar15 = pLVar10;
      pIVar13 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,local_40,false);
      pBVar14 = InsertCompareBranch(pLVar15,&pIVar13->super_Opnd,&pAVar11->super_Opnd,BrEq_A,false,
                                    local_50,insertBeforeInstr,false);
      LowererMD::InsertObjectPoison((Opnd *)pLVar10,pBVar14,insertBeforeInstr,isStore);
      instr = IR::LabelInstr::New(Label,local_48->m_func,true);
      IR::Instr::InsertBefore(insertBeforeInstr,&instr->super_Instr);
      if (isStore) {
        pAVar11 = (AddrOpnd *)IR::RegOpnd::New(TyUint64,local_40);
        iVar8 = (*local_40->m_scriptContextInfo->_vptr_ScriptContextInfo[0x14])();
        pMVar12 = IR::MemRefOpnd::New(CONCAT44(extraout_var_00,iVar8),TyUint64,local_40,
                                      AddrOpndKindDynamicMisc);
        InsertMove((Opnd *)pAVar11,&pMVar12->super_Opnd,insertBeforeInstr,true);
      }
      else {
        pSVar1 = insertBeforeInstr->m_func->m_scriptContextInfo;
        iVar8 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,0x22);
        pAVar11 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_02,iVar8),AddrOpndKindDynamicVtable,
                                    local_48->m_func,false,(Var)0x0);
      }
      pLVar15 = pLVar10;
      pIVar13 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,local_40,false);
      pBVar14 = InsertCompareBranch(pLVar15,&pIVar13->super_Opnd,&pAVar11->super_Opnd,BrNeq_A,false,
                                    isNotArrayLabel,insertBeforeInstr,false);
      LowererMD::InsertObjectPoison((Opnd *)pLVar10,pBVar14,insertBeforeInstr,isStore);
      this_00 = &local_48->m_lowererMD;
      LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,(Opnd *)pLVar10);
      instr_00 = IR::Instr::New(Call,local_48->m_func);
      IR::Instr::InsertBefore(insertBeforeInstr,instr_00);
      LowererMD::ChangeToHelperCall
                (this_00,instr_00,HelperIntArr_ToNativeFloatArray,(LabelInstr *)0x0,(Opnd *)0x0,
                 (PropertySymOpnd *)0x0,false);
      InsertBranch(Br,false,isNotArrayLabel,insertBeforeInstr);
      IR::Instr::InsertBefore(insertBeforeInstr,&local_50->super_Instr);
      goto LAB_005d768c;
    }
  }
  bVar3 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    local_58 = IR::LabelInstr::New(Label,local_48->m_func,false);
    pLVar15 = pLVar10;
    pIVar13 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,local_40,false);
    InsertCompareBranch(pLVar15,&pIVar13->super_Opnd,&pAVar11->super_Opnd,BrEq_A,false,local_58,
                        insertBeforeInstr,false);
    if ((uint)local_50 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3c82,"(virtualVtableAddress)","virtualVtableAddress");
      if (!bVar3) goto LAB_005d76f0;
      *puVar9 = 0;
    }
    pSVar1 = insertBeforeInstr->m_func->m_scriptContextInfo;
    iVar8 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,(ulong)(uint)local_50);
    pAVar11 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_01,iVar8),AddrOpndKindDynamicVtable,
                                local_48->m_func,false,(Var)0x0);
    if (pAVar11 == (AddrOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3c84,"(vtableVirtualOpnd)","vtableVirtualOpnd");
      if (!bVar3) {
LAB_005d76f0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pLVar15 = pLVar10;
    pIVar13 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,local_40,false);
    pBVar14 = InsertCompareBranch(pLVar15,&pIVar13->super_Opnd,&pAVar11->super_Opnd,BrNeq_A,false,
                                  isNotArrayLabel,insertBeforeInstr,false);
    LowererMD::InsertObjectPoison((Opnd *)pLVar10,pBVar14,insertBeforeInstr,isStore);
    IR::Instr::InsertBefore(insertBeforeInstr,&local_58->super_Instr);
  }
  else {
    pLVar15 = pLVar10;
    pIVar13 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,local_40,false);
    pBVar14 = InsertCompareBranch(pLVar15,&pIVar13->super_Opnd,&pAVar11->super_Opnd,BrNeq_A,false,
                                  isNotArrayLabel,insertBeforeInstr,false);
    LowererMD::InsertObjectPoison((Opnd *)pLVar10,pBVar14,insertBeforeInstr,isStore);
  }
LAB_005d768c:
  local_34 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar10->m_lowererMD).FloatPrefThreshold
  ;
  bVar3 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_34.field_0);
  if (bVar3) {
    bVar3 = ValueType::IsObject((ValueType *)&local_34.field_0);
    if (!bVar3) {
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_34.field_0,false);
    }
  }
  local_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::ToDefiniteObject((ValueType *)&local_34.field_0);
  IR::Opnd::SetValueType((Opnd *)pLVar10,(ValueType)local_34);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  return (RegOpnd *)pLVar10;
}

Assistant:

IR::RegOpnd *Lowerer::GenerateArrayTest(
    IR::RegOpnd *const baseOpnd,
    IR::LabelInstr *const isNotObjectLabel,
    IR::LabelInstr *const isNotArrayLabel,
    IR::Instr *const insertBeforeInstr,
    const bool forceFloat,
    const bool isStore,
    const bool allowDefiniteArray)
{
    Assert(baseOpnd);

    const ValueType baseValueType(baseOpnd->GetValueType());

    // Shouldn't request to do an array test when it's already known to be an array, or if it's unlikely to be an array
    Assert(!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray());
    Assert(baseValueType.IsUninitialized() || baseValueType.HasBeenObject());

    Assert(isNotObjectLabel);
    Assert(isNotArrayLabel);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    IR::RegOpnd *arrayOpnd;
    IR::AutoReuseOpnd autoReuseArrayOpnd;
    if(baseValueType.IsLikelyObject() && baseValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        // Only DynamicObject is allowed (DynamicObject vtable is ensured) because some object types have special handling for
        // index properties - arguments object, string object, external object, etc.
        // JavascriptArray::Jit_TryGetArrayForObjectWithArray as well.
        GenerateObjectTypeTest(baseOpnd, insertBeforeInstr, isNotObjectLabel);
        GenerateObjectHeaderInliningTest(baseOpnd, isNotArrayLabel, insertBeforeInstr);
        arrayOpnd = LoadObjectArray(baseOpnd, insertBeforeInstr);
        autoReuseArrayOpnd.Initialize(arrayOpnd, func, false /* autoDelete */);

        // test array, array
        // je   $isNotArrayLabel
        // test array, 1
        // jne  $isNotArrayLabel
        InsertTestBranch(
            arrayOpnd,
            arrayOpnd,
            Js::OpCode::BrEq_A,
            isNotArrayLabel,
            insertBeforeInstr);
        InsertTestBranch(
            arrayOpnd,
            IR::IntConstOpnd::New(1, TyUint8, func, true),
            Js::OpCode::BrNeq_A,
            isNotArrayLabel,
            insertBeforeInstr);
    }
    else
    {
        if(!baseOpnd->IsNotTaggedValue())
        {
            m_lowererMD.GenerateObjectTest(baseOpnd, insertBeforeInstr, isNotObjectLabel);
        }
        arrayOpnd = baseOpnd->Copy(func)->AsRegOpnd();
        if(!baseValueType.IsLikelyAnyOptimizedArray())
        {
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array)
                    .ToLikely()
                    .SetHasNoMissingValues(false)
                    .SetArrayTypeId(Js::TypeIds_Array));
        }
        autoReuseArrayOpnd.Initialize(arrayOpnd, func, false /* autoDelete */);
    }

    VTableValue vtableAddress = baseValueType.IsLikelyAnyOptimizedArray()
                ? GetArrayVtableAddress(baseValueType)
                : VTableValue::VtableJavascriptArray;

    VTableValue virtualVtableAddress = VTableValue::VtableInvalid;
    if (baseValueType.IsLikelyMixedTypedArrayType())
    {
        virtualVtableAddress = GetArrayVtableAddress(baseValueType, true);
    }
    IR::Opnd * vtableOpnd;
    IR::Opnd * vtableVirtualOpnd = nullptr;
    if (isStore &&
        (vtableAddress == VTableValue::VtableJavascriptArray ||
         baseValueType.IsLikelyNativeArray()))
    {
        vtableOpnd = IR::RegOpnd::New(TyMachPtr, func);
        if (baseValueType.IsLikelyNativeArray())
        {
            if (baseValueType.HasIntElements())
            {
                InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesIntArraySetElementFastPathVtable), insertBeforeInstr);
            }
            else
            {
                Assert(baseValueType.HasFloatElements());
                InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesFloatArraySetElementFastPathVtable), insertBeforeInstr);
            }
        }
        else
        {
            InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesArraySetElementFastPathVtable), insertBeforeInstr);
        }
    }
    else
    {
        vtableOpnd = LoadVTableValueOpnd(insertBeforeInstr, vtableAddress);
    }

    // cmp  [array], vtableAddress
    // jne  $isNotArrayLabel

    if (forceFloat && baseValueType.IsLikelyNativeFloatArray())
    {
        // We expect a native float array. If we get native int instead, convert it on the spot and bail out afterward.
        const auto goodArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::BranchInstr* branchInstr = InsertCompareBranch(
            IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
            vtableOpnd,
            Js::OpCode::BrEq_A,
            goodArrayLabel,
            insertBeforeInstr);

        InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);

        IR::LabelInstr *notFloatArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        insertBeforeInstr->InsertBefore(notFloatArrayLabel);

        if (isStore)
        {
            vtableOpnd = IR::RegOpnd::New(TyMachPtr, func);
            InsertMove(vtableOpnd, IR::MemRefOpnd::New(
                           func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr(),
                           TyMachPtr, func), insertBeforeInstr);
        }
        else
        {
            vtableOpnd = LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableJavascriptNativeIntArray);
        }

        branchInstr = InsertCompareBranch(
            IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
            vtableOpnd,
            Js::OpCode::BrNeq_A,
            isNotArrayLabel,
            insertBeforeInstr);

        InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);

        m_lowererMD.LoadHelperArgument(insertBeforeInstr, arrayOpnd);

        IR::Instr *helperInstr = IR::Instr::New(Js::OpCode::Call, m_func);
        insertBeforeInstr->InsertBefore(helperInstr);
        m_lowererMD.ChangeToHelperCall(helperInstr, IR::HelperIntArr_ToNativeFloatArray);

        // Branch to the (bailout) label, because converting the array may have made our array checks unsafe.
        InsertBranch(Js::OpCode::Br, isNotArrayLabel, insertBeforeInstr);

        insertBeforeInstr->InsertBefore(goodArrayLabel);
    }
    else
    {
        IR::LabelInstr* goodArrayLabel = nullptr;
        if (baseValueType.IsLikelyMixedTypedArrayType())
        {
            goodArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableOpnd,
                Js::OpCode::BrEq_A,
                goodArrayLabel,
                insertBeforeInstr);
            Assert(virtualVtableAddress);
            vtableVirtualOpnd = LoadVTableValueOpnd(insertBeforeInstr, virtualVtableAddress);
            Assert(vtableVirtualOpnd);
            IR::BranchInstr* branchInstr = InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableVirtualOpnd,
                Js::OpCode::BrNeq_A,
                isNotArrayLabel,
                insertBeforeInstr);

            InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);
            insertBeforeInstr->InsertBefore(goodArrayLabel);
        }
        else
        {
            IR::BranchInstr *branchInstr = InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableOpnd,
                Js::OpCode::BrNeq_A,
                isNotArrayLabel,
                insertBeforeInstr);

            InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);
        }

    }

    ValueType arrayValueType(arrayOpnd->GetValueType());
    if(arrayValueType.IsLikelyArrayOrObjectWithArray() && !arrayValueType.IsObject())
    {
        arrayValueType = arrayValueType.SetHasNoMissingValues(false);
    }
    arrayValueType = arrayValueType.ToDefiniteObject();
    arrayOpnd->SetValueType(arrayValueType);
    return arrayOpnd;
}